

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double fisk_pdf(double x,double a,double b,double c)

{
  double dVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (a < x) {
    dVar2 = (x - a) / b;
    dVar1 = pow(dVar2,c + -1.0);
    dVar2 = pow(dVar2,c);
    dVar2 = (dVar1 * (c / b)) / ((dVar2 + 1.0) * (dVar2 + 1.0));
  }
  return dVar2;
}

Assistant:

double fisk_pdf ( double x, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    FISK_PDF evaluates the Fisk PDF.
//
//  Discussion:
//
//    PDF(A,B,C;X) =
//      ( C / B ) * ( ( X - A ) / B )^( C - 1 ) /
//      ( 1 + ( ( X - A ) / B )^C )^2
//
//    The Fisk PDF is also known as the Log Logistic PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    A <= X
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < B,
//    0.0 < C.
//
//    Output, double FISK_PDF, the value of the PDF.
//
{
  double pdf;
  double y;

  if ( x <= a )
  {
    pdf = 0.0;
  }
  else
  {
    y = ( x - a ) / b;

    pdf = ( c / b ) * pow ( y, ( c - 1.0 ) ) / pow ( ( 1.0 + pow ( y, c ) ), 2 );
  }

  return pdf;
}